

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  options __x;
  bool bVar1;
  reference pbVar2;
  char *pcVar3;
  runtime_error *this;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  TVar4;
  undefined1 local_2e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  ulong local_238;
  undefined8 uStack_230;
  seed_t local_228;
  undefined1 local_219;
  char local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [36];
  undefined4 local_144;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  string local_130 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_d0 [8];
  text arg;
  string local_b0 [8];
  text val;
  string local_90 [8];
  text opt;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70 [3];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  iterator pos;
  undefined1 local_48 [7];
  bool in_options;
  texts in;
  undefined1 uStack_28;
  undefined1 uStack_27;
  byte bStack_26;
  undefined1 uStack_25;
  options option;
  texts *args_local;
  
  options::options((options *)
                   ((long)&in.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  pos._M_current._7_1_ = 1;
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  do {
    local_70[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar1 = __gnu_cxx::operator!=(&local_58,local_70);
    if (!bVar1) {
      local_2e9 = 1;
      if ((bStack_26 & 1) == 0) {
        local_2e9 = uStack_25;
      }
      local_228._0_1_ = option.lexical;
      local_228._1_1_ = option.random;
      local_228._2_1_ = option.verbose;
      local_228._3_1_ = option.version;
      local_238 = CONCAT17(uStack_25,
                           CONCAT16(local_2e9,
                                    CONCAT15(uStack_27,
                                             CONCAT14(uStack_28,
                                                      CONCAT13(in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._7_1_,CONCAT12(in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._6_1_,CONCAT11(in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,in.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_))))))) & 0xff01ffffffffffff;
      uStack_230 = CONCAT44(option._4_4_,
                            CONCAT13(option.list,
                                     CONCAT12(option.count,CONCAT11(option.abort,option.help))));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_250,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48);
      __x.lexical = (bool)(undefined1)uStack_230;
      __x.random = (bool)uStack_230._1_1_;
      __x.verbose = (bool)uStack_230._2_1_;
      __x.version = (bool)uStack_230._3_1_;
      __x.repeat = uStack_230._4_4_;
      __x.help = (bool)(undefined1)local_238;
      __x.abort = (bool)local_238._1_1_;
      __x.count = (bool)local_238._2_1_;
      __x.list = (bool)local_238._3_1_;
      __x.tags = (bool)local_238._4_1_;
      __x.time = (bool)local_238._5_1_;
      __x.pass = (bool)local_238._6_1_;
      __x.zen = (bool)local_238._7_1_;
      __x.seed = local_228;
      std::
      make_pair<lest::options,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,__x,&local_250);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250);
      local_144 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string(local_90);
    std::__cxx11::string::string(local_b0);
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_58);
    std::__cxx11::string::string(local_d0,(string *)pbVar2);
    std::__cxx11::string::string(local_130,local_d0);
    split_option(&local_110,(text *)local_130);
    TVar4 = tie<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b0);
    local_140 = TVar4;
    Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_140,&local_110);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_110);
    std::__cxx11::string::~string(local_130);
    if ((pos._M_current._7_1_ & 1) == 0) {
LAB_00104f80:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,(value_type *)local_d0);
      local_144 = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      if (*pcVar3 != '-') {
        pos._M_current._7_1_ = 0;
        goto LAB_00104f80;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"--");
      if (bVar1) {
        pos._M_current._7_1_ = 0;
        local_144 = 4;
        goto LAB_00104f9c;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"-h");
      if (bVar1) {
LAB_001047da:
        in.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
        local_144 = 4;
      }
      else {
        bVar1 = std::operator==("--help",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_90);
        if (bVar1) goto LAB_001047da;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"-a");
        if (bVar1) {
LAB_0010483b:
          in.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_144 = 4;
        }
        else {
          bVar1 = std::operator==("--abort",
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90);
          if (bVar1) goto LAB_0010483b;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"-c");
          if (bVar1) {
LAB_0010489c:
            in.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
            local_144 = 4;
          }
          else {
            bVar1 = std::operator==("--count",
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_90);
            if (bVar1) goto LAB_0010489c;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_90,"-g");
            if (bVar1) {
LAB_001048fd:
              uStack_28 = 1;
              local_144 = 4;
            }
            else {
              bVar1 = std::operator==("--list-tags",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_90);
              if (bVar1) goto LAB_001048fd;
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_90,"-l");
              if (bVar1) {
LAB_0010495e:
                in.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                local_144 = 4;
              }
              else {
                bVar1 = std::operator==("--list-tests",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_90);
                if (bVar1) goto LAB_0010495e;
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_90,"-t");
                if (bVar1) {
LAB_001049bf:
                  uStack_27 = 1;
                  local_144 = 4;
                }
                else {
                  bVar1 = std::operator==("--time",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90);
                  if (bVar1) goto LAB_001049bf;
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_90,"-p");
                  if (bVar1) {
LAB_00104a20:
                    bStack_26 = 1;
                    local_144 = 4;
                  }
                  else {
                    bVar1 = std::operator==("--pass",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90);
                    if (bVar1) goto LAB_00104a20;
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_90,"-z");
                    if (bVar1) {
LAB_00104a81:
                      uStack_25 = 1;
                      local_144 = 4;
                    }
                    else {
                      bVar1 = std::operator==("--pass-zen",
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_90);
                      if (bVar1) goto LAB_00104a81;
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_90,"-v");
                      if (bVar1) {
LAB_00104ae2:
                        option.count = true;
                        local_144 = 4;
                      }
                      else {
                        bVar1 = std::operator==("--verbose",
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_90);
                        if (bVar1) goto LAB_00104ae2;
                        bVar1 = std::operator==("--version",
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_90);
                        if (bVar1) {
                          option.list = true;
                          local_144 = 4;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--order");
                          if (bVar1) {
                            bVar1 = std::operator==("declared",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0);
                            if (bVar1) {
                              local_144 = 4;
                              goto LAB_00104f9c;
                            }
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--order");
                          if (bVar1) {
                            bVar1 = std::operator==("lexical",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0);
                            if (bVar1) {
                              option.help = true;
                              local_144 = 4;
                              goto LAB_00104f9c;
                            }
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--order");
                          if (bVar1) {
                            bVar1 = std::operator==("random",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0);
                            if (bVar1) {
                              option.abort = true;
                              local_144 = 4;
                              goto LAB_00104f9c;
                            }
                          }
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--random-seed");
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_168,"--random-seed",&local_169);
                            std::__cxx11::string::string(local_190,local_b0);
                            option._8_4_ = seed((text *)local_168,(text *)local_190);
                            std::__cxx11::string::~string(local_190);
                            std::__cxx11::string::~string(local_168);
                            std::allocator<char>::~allocator((allocator<char> *)&local_169);
                            local_144 = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--repeat");
                            if (!bVar1) {
                              local_219 = 1;
                              this = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::operator+(local_218,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)"unrecognised option \'");
                              std::operator+(local_1f8,local_218);
                              std::runtime_error::runtime_error(this,(string *)local_1f8);
                              local_219 = 0;
                              __cxa_throw(this,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_1b0,"--repeat",&local_1b1);
                            std::__cxx11::string::string(local_1d8,local_b0);
                            option._4_4_ = repeat((text *)local_1b0,(text *)local_1d8);
                            std::__cxx11::string::~string(local_1d8);
                            std::__cxx11::string::~string(local_1b0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
                            local_144 = 4;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00104f9c:
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}